

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O0

void set_derives(void)

{
  char *pcVar1;
  char *pcVar2;
  Yshort *rules;
  int local_10;
  int lhs;
  int k;
  int i;
  
  derives = (Yshort **)allocate(nsyms << 3);
  pcVar2 = allocate((nvars + nrules) * 4);
  local_10 = 0;
  for (rules._4_4_ = start_symbol; rules._4_4_ < nsyms; rules._4_4_ = rules._4_4_ + 1) {
    derives[rules._4_4_] = (Yshort *)(pcVar2 + (long)local_10 * 4);
    for (lhs = 0; lhs < nrules; lhs = lhs + 1) {
      if (rlhs[lhs] == rules._4_4_) {
        *(int *)(pcVar2 + (long)local_10 * 4) = lhs;
        local_10 = local_10 + 1;
      }
    }
    pcVar1 = pcVar2 + (long)local_10 * 4;
    pcVar1[0] = -1;
    pcVar1[1] = -1;
    pcVar1[2] = -1;
    pcVar1[3] = -1;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void set_derives()
{
    register int i, k;
    register int lhs;
    register Yshort *rules;

    derives = NEW2(nsyms, Yshort *);
    rules = NEW2(nvars + nrules, Yshort);

    k = 0;
    for (lhs = start_symbol; lhs < nsyms; lhs++)
    {
	derives[lhs] = rules + k;
	for (i = 0; i < nrules; i++)
	{
	    if (rlhs[i] == lhs)
	    {
		rules[k] = i;
		k++;
	    }
	}
	rules[k] = -1;
	k++;
    }

#ifdef	DEBUG
    print_derives();
#endif
}